

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O1

void __thiscall Js::FunctionBody::InitDisableInlineSpread(FunctionBody *this)

{
  uint sourceContextId;
  FunctionInfo *pFVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  
  if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_0078143b;
    *puVar5 = 0;
  }
  pFVar1 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar1->functionId == 0xffffffff) {
    uVar4 = 0;
  }
  else {
    sourceContextId =
         ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
            m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
    if (pFVar1 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) {
LAB_0078143b:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    bVar3 = Phases::IsEnabled((Phases *)&DAT_015bbe90,InlinePhase,sourceContextId,
                              ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                              ptr)->functionId);
    uVar4 = (uint)bVar3 << 0xd;
  }
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xffffdfff | uVar4;
  return;
}

Assistant:

void InitDisableInlineSpread()        { disableInlineSpread = this->GetLocalFunctionId() != Js::Constants::NoFunctionId && PHASE_OFF(Js::InlinePhase, this); }